

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall
ON_Xform::DecomposeAffine(ON_Xform *this,ON_3dVector *T,ON_Xform *R,ON_Xform *Q,ON_3dVector *lambda)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  double dVar4;
  bool local_559;
  ON_3dVector local_550;
  ON_Xform local_538;
  ON_Xform local_4b8;
  ON_Xform local_438;
  ON_Xform local_3b8;
  ON_Xform local_338;
  undefined1 local_2b8 [8];
  ON_Xform Diag;
  ON_Xform QT;
  ON_Xform LTL;
  ON_Xform LT;
  ON_Xform L;
  bool rc;
  ON_3dVector *lambda_local;
  ON_Xform *Q_local;
  ON_Xform *R_local;
  ON_3dVector *T_local;
  ON_Xform *this_local;
  
  L.m_xform[3][3]._7_1_ = false;
  bVar2 = IsAffine(this);
  if (bVar2) {
    ON_Xform((ON_Xform *)(LT.m_xform[3] + 3));
    DecomposeAffine(this,T,(ON_Xform *)(LT.m_xform[3] + 3));
    memcpy(LTL.m_xform[3] + 3,LT.m_xform[3] + 3,0x80);
    Transpose((ON_Xform *)(LTL.m_xform[3] + 3));
    operator*((ON_Xform *)(QT.m_xform[3] + 3),(ON_Xform *)(LTL.m_xform[3] + 3),
              (ON_Xform *)(LT.m_xform[3] + 3));
    L.m_xform[3][3]._7_1_ = DecomposeSymmetric((ON_Xform *)(QT.m_xform[3] + 3),Q,lambda);
    if (L.m_xform[3][3]._7_1_) {
      pdVar3 = ON_3dVector::operator[](lambda,0);
      local_559 = false;
      if (0.0 < *pdVar3) {
        pdVar3 = ON_3dVector::operator[](lambda,1);
        local_559 = false;
        if (0.0 < *pdVar3) {
          pdVar3 = ON_3dVector::operator[](lambda,2);
          local_559 = 0.0 < *pdVar3;
        }
      }
      L.m_xform[3][3]._7_1_ = local_559;
      if (local_559 != false) {
        pdVar3 = ON_3dVector::operator[](lambda,0);
        dVar4 = sqrt(*pdVar3);
        pdVar3 = ON_3dVector::operator[](lambda,0);
        *pdVar3 = dVar4;
        pdVar3 = ON_3dVector::operator[](lambda,1);
        dVar4 = sqrt(*pdVar3);
        pdVar3 = ON_3dVector::operator[](lambda,1);
        *pdVar3 = dVar4;
        pdVar3 = ON_3dVector::operator[](lambda,2);
        dVar4 = sqrt(*pdVar3);
        pdVar3 = ON_3dVector::operator[](lambda,2);
        *pdVar3 = dVar4;
        memcpy(Diag.m_xform[3] + 3,Q,0x80);
        Transpose((ON_Xform *)(Diag.m_xform[3] + 3));
        pdVar3 = ON_3dVector::operator[](lambda,0);
        dVar4 = *pdVar3;
        pdVar3 = ON_3dVector::operator[](lambda,1);
        dVar1 = *pdVar3;
        pdVar3 = ON_3dVector::operator[](lambda,2);
        DiagonalTransformation((ON_Xform *)local_2b8,1.0 / dVar4,1.0 / dVar1,1.0 / *pdVar3);
        operator*(&local_3b8,Q,(ON_Xform *)local_2b8);
        operator*(&local_338,&local_3b8,(ON_Xform *)(Diag.m_xform[3] + 3));
        memcpy(R,&local_338,0x80);
        operator*(&local_438,(ON_Xform *)(LT.m_xform[3] + 3),R);
        memcpy(R,&local_438,0x80);
        dVar4 = Determinant(R,(double *)0x0);
        if (dVar4 < 0.0) {
          ON_Xform(&local_538,-1.0);
          operator*(&local_4b8,&local_538,R);
          memcpy(R,&local_4b8,0x80);
          ::operator*(&local_550,-1,lambda);
          lambda->x = local_550.x;
          lambda->y = local_550.y;
          lambda->z = local_550.z;
        }
        Orthogonalize(R,2.3283064365386963e-10);
      }
    }
  }
  return L.m_xform[3][3]._7_1_;
}

Assistant:

bool ON_Xform::DecomposeAffine(ON_3dVector& T, ON_Xform& R,
	ON_Xform& Q, ON_3dVector& lambda) const
{
	bool rc = false;
	if (IsAffine())
	{
		ON_Xform L;
		DecomposeAffine(T, L);
		ON_Xform LT = L;
		LT.Transpose();
		ON_Xform LTL = LT * L;

		rc = LTL.DecomposeSymmetric(Q, lambda);
		if (rc)
		{
			rc = (lambda[0] > 0 && lambda[1] > 0 && lambda[2] > 0);
			if(rc)
			{
				lambda[0] = sqrt(lambda[0]);
				lambda[1] = sqrt(lambda[1]);
				lambda[2] = sqrt(lambda[2]);
				ON_Xform QT = Q;
				QT.Transpose();
				ON_Xform Diag = ON_Xform::DiagonalTransformation(1.0 / lambda[0], 1.0 / lambda[1], 1.0 / lambda[2]);
				R = Q * Diag * QT;
				R = L * R;

				if (R.Determinant() < 0)
				{
					R = ON_Xform(-1) * R;
					lambda = -1 * lambda;
				}
				R.Orthogonalize(ON_ZERO_TOLERANCE);  // tune it up - tol should be <= that in 
																							// Is_Rotation()
			}
		}
	}
	return rc;
}